

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O2

void __thiscall AndMeaning::TracePointers(AndMeaning *this,function<void_(Sexp_**)> *func)

{
  pointer ppSVar1;
  Sexp **arg;
  pointer __args;
  
  ppSVar1 = (this->arguments).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (__args = (this->arguments).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                super__Vector_impl_data._M_start; __args != ppSVar1; __args = __args + 1) {
    std::function<void_(Sexp_**)>::operator()(func,__args);
  }
  return;
}

Assistant:

void TracePointers(std::function<void(Sexp **)> func) override {
    for (auto &arg : arguments) {
      func(&arg);
    }
  }